

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_emr_job_resource.cc
# Opt level: O2

int __thiscall
aliyun::Emr::JobResource
          (Emr *this,EmrJobResourceRequestType *req,EmrJobResourceResponseType *response,
          EmrErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_3b4;
  allocator<char> local_3b3;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  Value val;
  undefined1 local_398 [8];
  _Alloc_hider local_390;
  undefined1 local_388 [24];
  long local_370;
  _Alloc_hider local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  vector<aliyun::EmrJobResourceJobResourceInfoType,_std::allocator<aliyun::EmrJobResourceJobResourceInfoType>_>
  *local_348;
  string local_340;
  string str_response;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"JobResource",(allocator<char> *)&local_340);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->bucket)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Bucket",(allocator<char> *)local_398);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->path)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Path",(allocator<char> *)local_398);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->path);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"RegionId",(allocator<char> *)local_398);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,this->region_id_,(allocator<char> *)&local_340);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EmrErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_398,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_398,anon_var_dwarf_13598b + 9,&local_3b1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_398);
        std::__cxx11::string::~string((string *)local_398);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_398,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_398,anon_var_dwarf_13598b + 9,&local_3b2);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_398);
        std::__cxx11::string::~string((string *)local_398);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_398,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_398,anon_var_dwarf_13598b + 9,&local_3b3);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_398);
        std::__cxx11::string::~string((string *)local_398);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_398,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_398,anon_var_dwarf_13598b + 9,&local_3b4);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_398);
        std::__cxx11::string::~string((string *)local_398);
      }
      if (response != (EmrJobResourceResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"JobResourceInfoList");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"JobResourceInfoList");
          bVar1 = Json::Value::isMember(pVVar5,"JobResourceInfo");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"JobResourceInfoList");
            pVVar5 = Json::Value::operator[](pVVar5,"JobResourceInfo");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              index = 0;
              local_348 = &response->job_resource_info_list;
              for (; AVar3 = Json::Value::size(pVVar5), index < AVar3; index = index + 1) {
                local_390._M_p = local_388 + 8;
                local_388._0_8_ = 0;
                local_388[8] = '\0';
                local_368._M_p = (pointer)&local_358;
                local_360 = 0;
                local_358._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"Type");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Type");
                  local_398._0_4_ = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Filename");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Filename");
                  Json::Value::asString_abi_cxx11_(&local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_390,(string *)&local_340);
                  response = (EmrJobResourceResponseType *)local_348;
                  std::__cxx11::string::~string((string *)&local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Size");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Size");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_370 = (long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar6,"Region");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"Region");
                  Json::Value::asString_abi_cxx11_(&local_340,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_368,(string *)&local_340);
                  response = (EmrJobResourceResponseType *)local_348;
                  std::__cxx11::string::~string((string *)&local_340);
                }
                std::
                vector<aliyun::EmrJobResourceJobResourceInfoType,_std::allocator<aliyun::EmrJobResourceJobResourceInfoType>_>
                ::push_back(&response->job_resource_info_list,(value_type *)local_398);
                EmrJobResourceJobResourceInfoType::~EmrJobResourceJobResourceInfoType
                          ((EmrJobResourceJobResourceInfoType *)local_398);
              }
            }
          }
        }
      }
      goto LAB_0013c2c9;
    }
  }
  iVar2 = -1;
  if (error_info != (EmrErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013c2c9:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Emr::JobResource(const EmrJobResourceRequestType& req,
                      EmrJobResourceResponseType* response,
                       EmrErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","JobResource");
  if(!req.bucket.empty()) {
    req_rpc->AddRequestQuery("Bucket", req.bucket);
  }
  if(!req.path.empty()) {
    req_rpc->AddRequestQuery("Path", req.path);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}